

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O1

Result * __thiscall
CoreML::
validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::GLMClassifier>
          (Result *__return_storage_ptr__,CoreML *this,Model *model,GLMClassifier *modelParameters,
          bool allowEmptyLabels,bool defaultClassLabelIsInt64)

{
  int iVar1;
  bool bVar2;
  Int64Vector *pIVar3;
  StringVector *pSVar4;
  char cVar5;
  byte unaff_BPL;
  size_type sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ModelDescription *interface;
  Result result;
  undefined1 local_48 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  iVar1 = *(int *)((long)&model[1].Type_ + 4);
  cVar5 = (char)modelParameters;
  if (iVar1 == 0) {
    if (cVar5 != '\0') goto LAB_0027c3d5;
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Classifier models must provide class labels.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_48);
  }
  else if (iVar1 == 100) {
    if ((cVar5 == '\0') && (*(int *)(*(long *)&model[1].specificationversion_ + 0x18) == 0)) {
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "Classifier declared to have String class labels must provide labels.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_48);
    }
    else {
      if (*(int *)((long)&model[1].Type_ + 4) == 0x65) {
        pIVar3 = *(Int64Vector **)&model[1].specificationversion_;
      }
      else {
        pIVar3 = Specification::Int64Vector::default_instance();
      }
      if ((pIVar3->vector_).current_size_ == 0) {
        allowEmptyLabels = false;
        goto LAB_0027c3d5;
      }
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "Classifier declared with String class labels must provide exclusively String class labels."
                 ,"");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_48);
    }
  }
  else {
    allowEmptyLabels = (bool)unaff_BPL;
    if (iVar1 != 0x65) {
LAB_0027c3d5:
      interface = *(ModelDescription **)(this + 0x10);
      if (interface == (ModelDescription *)0x0) {
        interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
      }
      validateFeatureDescriptions((Result *)local_48,interface,*(int *)(this + 0x18));
      bVar2 = Result::good((Result *)local_48);
      if (bVar2) {
        validateClassifierFeatureDescriptions
                  (__return_storage_ptr__,interface,(bool)(allowEmptyLabels & 1));
      }
      else {
        __return_storage_ptr__->m_type = local_48._0_4_;
        __return_storage_ptr__->m_reason = local_48._4_4_;
        paVar7 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._8_8_ == &local_30) {
          paVar7->_M_allocated_capacity =
               CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_30._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)local_48._8_8_;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_48._16_8_;
        local_48._16_8_ = 0;
        local_30._M_local_buf[0] = '\0';
        local_48._8_8_ = &local_30;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._8_8_ == &local_30) {
        return __return_storage_ptr__;
      }
      sVar6 = CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_48._8_8_;
      goto LAB_0027c4e8;
    }
    if ((cVar5 == '\0') && (*(int *)(*(long *)&model[1].specificationversion_ + 0x10) == 0)) {
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "Classifier declared to have Int64 class labels must provide labels.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_48);
    }
    else {
      if (*(int *)((long)&model[1].Type_ + 4) == 100) {
        pSVar4 = *(StringVector **)&model[1].specificationversion_;
      }
      else {
        pSVar4 = Specification::StringVector::default_instance();
      }
      if ((pSVar4->vector_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        allowEmptyLabels = true;
        goto LAB_0027c3d5;
      }
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "Classifier declared with Int64 class labels must provide exclusively Int64 class labels."
                 ,"");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_48);
    }
  }
  sVar6 = local_48._16_8_;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_48._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_48 + 0x10)) {
    return __return_storage_ptr__;
  }
LAB_0027c4e8:
  operator_delete(paVar7,sVar6 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validateClassifierInterface(const T& model,
                                       const U& modelParameters,
                                       const bool allowEmptyLabels = false,
                                       const bool defaultClassLabelIsInt64 = false) {
        
        bool expected_class_is_int64;
        
        // validate class labels
        switch (modelParameters.ClassLabels_case()) {
            case U::kInt64ClassLabels:
                if (!allowEmptyLabels && modelParameters.int64classlabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have Int64 class labels must provide labels.");
                }
                
                if(modelParameters.stringclasslabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared with Int64 class labels must provide exclusively Int64 class labels.");
                }
                
                expected_class_is_int64 = true;
                
                break;
                
            case U::kStringClassLabels:
                if (!allowEmptyLabels && modelParameters.stringclasslabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have String class labels must provide labels.");
                }
                
                if(modelParameters.int64classlabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                    "Classifier declared with String class labels must provide exclusively String class labels.");
                }
                
                expected_class_is_int64 = false;
                
                break;
                
            case U::CLASSLABELS_NOT_SET:
                if (!allowEmptyLabels) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Classifier models must provide class labels.");
                }
                expected_class_is_int64 = defaultClassLabelIsInt64;
                break;
        }
        const Specification::ModelDescription& interface = model.description();
        
            // Validate feature descriptions
        Result result = validateFeatureDescriptions(interface, model.specificationversion());
        if (!result.good()) {
            return result;
        }

        return validateClassifierFeatureDescriptions(interface, expected_class_is_int64);
    }